

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_float_field
          (OneofWellKnownTypes *this,FloatValue *float_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  FloatValue *float_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (float_field != (FloatValue *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)float_field);
    message_arena = (Arena *)float_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::FloatValue>
                              (message_arena_00,float_field,submessage_arena_00);
    }
    set_has_float_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_float_field(::google::protobuf::FloatValue* PROTOBUF_NULLABLE float_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (float_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(float_field)->GetArena();
    if (message_arena != submessage_arena) {
      float_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, float_field, submessage_arena);
    }
    set_has_float_field();
    _impl_.oneof_field_.float_field_ = float_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.float_field)
}